

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

void __thiscall Node::addDestNode(Node *this,Node *n)

{
  vector<Node_*,_std::allocator<Node_*>_> *in_RSI;
  
  std::vector<Node_*,_std::allocator<Node_*>_>::push_back(in_RSI,(value_type *)in_RSI);
  return;
}

Assistant:

void Node::addDestNode(Node &n)
{
    _nodes.push_back(&n);
}